

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O1

void __thiscall create::Serial::~Serial(Serial *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Manager_type p_Var3;
  service_registry *psVar4;
  _func_int ***ppp_Var5;
  int iVar6;
  service *psVar7;
  
  this->_vptr_Serial = (_func_int **)&PTR___cxa_pure_virtual_00156648;
  disconnect(this);
  p_Var2 = (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var3 = (this->callback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->dataReadyCond);
  if ((this->ioThread)._M_id._M_thread != 0) {
    std::terminate();
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_serial_port_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->port).impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::signal_set_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->signals).impl_);
  for (psVar7 = ((this->io).super_execution_context.service_registry_)->first_service_;
      psVar7 != (service *)0x0; psVar7 = psVar7->next_) {
    (*psVar7->_vptr_service[2])(psVar7);
  }
  psVar4 = (this->io).super_execution_context.service_registry_;
  psVar7 = psVar4->first_service_;
  while (psVar7 != (service *)0x0) {
    ppp_Var5 = &psVar7->_vptr_service;
    psVar7 = psVar7->next_;
    (*(*ppp_Var5)[1])();
    psVar4->first_service_ = psVar7;
  }
  psVar4 = (this->io).super_execution_context.service_registry_;
  if (psVar4 != (service_registry *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&psVar4->mutex_);
    operator_delete(psVar4);
  }
  p_Var2 = (this->super_enable_shared_from_this<create::Serial>)._M_weak_this.
           super___weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Serial::~Serial() {
    disconnect();
  }